

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgHierarchyManipulator.cpp
# Opt level: O3

Data2D<int> *
TasGrid::HierarchyManipulations::computeDAGup<(TasGrid::RuleLocal::erule)1>
          (Data2D<int> *__return_storage_ptr__,MultiIndexSet *mset,bool *is_complete)

{
  size_type __n;
  pointer piVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  int iVar5;
  size_t j;
  size_type sVar6;
  size_t sVar7;
  pointer p;
  unsigned_long __n2;
  pointer __src;
  size_t sVar8;
  long lVar9;
  vector<int,_std::allocator<int>_> dad;
  allocator_type local_79;
  Data2D<int> *local_78;
  vector<int,_std::allocator<int>_> *local_70;
  vector<int,_std::allocator<int>_> local_68;
  bool *local_50;
  size_t local_48;
  size_t local_40;
  size_t local_38;
  
  __n = mset->num_dimensions;
  sVar8 = (size_t)mset->cache_num_indexes;
  __return_storage_ptr__->stride = (long)(int)__n;
  __return_storage_ptr__->num_strips = sVar8;
  local_78 = __return_storage_ptr__;
  ::std::vector<int,_std::allocator<int>_>::vector
            (&__return_storage_ptr__->vec,(long)(int)__n * sVar8,(allocator_type *)&local_68);
  local_50 = is_complete;
  if ((long)sVar8 < 1) {
    bVar2 = true;
  }
  else {
    local_48 = __n * 4;
    sVar7 = 0;
    bVar2 = false;
    local_70 = &__return_storage_ptr__->vec;
    local_40 = sVar8;
    do {
      __src = (mset->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start + mset->num_dimensions * sVar7;
      ::std::vector<int,_std::allocator<int>_>::vector(&local_68,__n,&local_79);
      local_38 = sVar7;
      if (__n == 0) {
        p = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
        if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (int *)0x0) goto LAB_001bc39d;
      }
      else {
        memmove(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start,__src,local_48);
        lVar9 = local_78->stride * sVar7;
        piVar1 = (local_78->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        sVar6 = 0;
        p = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
        do {
          iVar3 = p[sVar6];
          if (iVar3 == 0) {
            piVar1[lVar9 + sVar6] = -1;
          }
          else {
            p[sVar6] = ((iVar3 - (iVar3 + 1 >> 0x1f)) + 1 >> 1) - (uint)(iVar3 < 4);
            iVar3 = MultiIndexSet::getSlot(mset,p);
            if (iVar3 == -1) {
              bVar2 = true;
            }
            piVar1[lVar9 + sVar6] = iVar3;
            iVar5 = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[sVar6];
            if (iVar5 != 0) {
              piVar4 = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + sVar6;
              do {
                if (iVar3 != -1) break;
                *piVar4 = ((iVar5 - (iVar5 + 1 >> 0x1f)) + 1 >> 1) - (uint)(iVar5 < 4);
                iVar3 = MultiIndexSet::getSlot
                                  (mset,local_68.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                piVar1[lVar9 + sVar6] = iVar3;
                piVar4 = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + sVar6;
                iVar5 = *piVar4;
              } while (iVar5 != 0);
            }
            local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[sVar6] = __src[sVar6];
            p = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
          }
          sVar6 = sVar6 + 1;
        } while (sVar6 != __n);
LAB_001bc39d:
        operator_delete(p,(long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage - (long)p);
      }
      sVar7 = local_38 + 1;
    } while (sVar7 != local_40);
    bVar2 = !bVar2;
  }
  *local_50 = bVar2;
  return local_78;
}

Assistant:

Data2D<int> computeDAGup(MultiIndexSet const &mset, bool &is_complete){
    size_t num_dimensions = mset.getNumDimensions();
    int num_points = mset.getNumIndexes();
    if (RuleLocal::getMaxNumParents<effrule>() > 1){ // allow for multiple parents and level 0 may have more than one node
        int max_parents = RuleLocal::getMaxNumParents<effrule>() * (int) num_dimensions;
        Data2D<int> parents(max_parents, num_points, -1);
        int level0_offset = RuleLocal::getNumPoints<effrule>(0);
        int any_fail = 0; // count if there are failures
        #pragma omp parallel
        {
            int fail = 0; // local thread count fails

            #pragma omp for schedule(static)
            for(int i=0; i<num_points; i++){
                const int *p = mset.getIndex(i);
                std::vector<int> dad(num_dimensions);
                std::copy_n(p, num_dimensions, dad.data());
                int *pp = parents.getStrip(i);
                for(size_t j=0; j<num_dimensions; j++){
                    if (dad[j] >= level0_offset){
                        int current = p[j];
                        dad[j] = RuleLocal::getParent<effrule>(current);
                        pp[2*j] = mset.getSlot(dad);
                        if (pp[2*j] == -1)
                            fail = 1;
                        while ((dad[j] >= level0_offset) && (pp[2*j] == -1)){
                            current = dad[j];
                            dad[j] = RuleLocal::getParent<effrule>(current);
                            pp[2*j] = mset.getSlot(dad);
                        }
                        dad[j] = RuleLocal::getStepParent<effrule>(current);
                        if (dad[j] != -1){
                            pp[2*j + 1] = mset.getSlot(dad);
                            if (pp[2*j + 1] == -1)
                                fail = 1;
                        }
                        dad[j] = p[j];
                    }
                }
            }

            #pragma omp atomic
            any_fail += fail;
        }
        is_complete = (any_fail == 0);
        return parents;
    }else{ // this assumes that level zero has only one node
        Data2D<int> parents((int) num_dimensions, num_points);
        int any_fail = 0; // count if there are failures
        #pragma omp parallel
        {
            int fail = 0; // local thread count fails

            #pragma omp for schedule(static)
            for(int i=0; i<num_points; i++){
                const int *p = mset.getIndex(i);
                std::vector<int> dad(num_dimensions);
                std::copy_n(p, num_dimensions, dad.data());
                int *pp = parents.getStrip(i);
                for(size_t j=0; j<num_dimensions; j++){
                    if (dad[j] == 0){
                        pp[j] = -1;
                    }else{
                        dad[j] = RuleLocal::getParent<effrule>(dad[j]);
                        pp[j] = mset.getSlot(dad.data());
                        if (pp[j] == -1)
                            fail = 1;
                        while((dad[j] != 0) && (pp[j] == -1)){
                            dad[j] = RuleLocal::getParent<effrule>(dad[j]);
                            pp[j] = mset.getSlot(dad);
                        }
                        dad[j] = p[j];
                    }
                }
            }

            #pragma omp atomic
            any_fail += fail;
        }
        is_complete = (any_fail == 0);
        return parents;
    }
}